

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

bool __thiscall Diligent::ThreadPoolImpl::ReprioritizeTask(ThreadPoolImpl *this,IAsyncTask *pTask)

{
  bool bVar1;
  bool bVar2;
  IAsyncTask *pIVar3;
  pointer ppVar4;
  undefined4 extraout_XMM0_Da;
  undefined1 local_70 [8];
  type ExistingTaskInfo;
  _Self local_48;
  _Self local_40;
  iterator it;
  unique_lock<std::mutex> lock;
  float Priority;
  IAsyncTask *pTask_local;
  ThreadPoolImpl *this_local;
  
  (*(pTask->super_IObject)._vptr_IObject[9])();
  lock._12_4_ = extraout_XMM0_Da;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&it,&this->m_TasksQueueMtx);
  local_40._M_node =
       (_Base_ptr)
       std::
       multimap<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo,_std::greater<float>,_std::allocator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
       ::begin(&this->m_TasksQueue);
  while( true ) {
    local_48._M_node =
         (_Base_ptr)
         std::
         multimap<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo,_std::greater<float>,_std::allocator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
         ::end(&this->m_TasksQueue);
    bVar1 = std::operator!=(&local_40,&local_48);
    bVar2 = false;
    if (bVar1) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>
               ::operator->(&local_40);
      pIVar3 = Diligent::RefCntAutoPtr::operator_cast_to_IAsyncTask_
                         ((RefCntAutoPtr *)&ppVar4->second);
      bVar2 = pIVar3 != pTask;
    }
    if (!bVar2) break;
    std::_Rb_tree_iterator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>::
    operator++(&local_40);
  }
  ExistingTaskInfo.Prerequisites.
  super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                multimap<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo,_std::greater<float>,_std::allocator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
                ::end(&this->m_TasksQueue);
  bVar2 = std::operator!=(&local_40,
                          (_Self *)&ExistingTaskInfo.Prerequisites.
                                    super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar2) {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>::
             operator->(&local_40);
    if ((ppVar4->first != (float)lock._12_4_) || (NAN(ppVar4->first) || NAN((float)lock._12_4_))) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>
               ::operator->(&local_40);
      QueuedTaskInfo::QueuedTaskInfo((QueuedTaskInfo *)local_70,&ppVar4->second);
      std::
      multimap<float,Diligent::ThreadPoolImpl::QueuedTaskInfo,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
      ::erase_abi_cxx11_((multimap<float,Diligent::ThreadPoolImpl::QueuedTaskInfo,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
                          *)&this->m_TasksQueue,(iterator)local_40._M_node);
      std::
      multimap<float,Diligent::ThreadPoolImpl::QueuedTaskInfo,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
      ::emplace<float_const&,Diligent::ThreadPoolImpl::QueuedTaskInfo>
                ((multimap<float,Diligent::ThreadPoolImpl::QueuedTaskInfo,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
                  *)&this->m_TasksQueue,(float *)&lock.field_0xc,(QueuedTaskInfo *)local_70);
      QueuedTaskInfo::~QueuedTaskInfo((QueuedTaskInfo *)local_70);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&it);
  return this_local._7_1_;
}

Assistant:

ReprioritizeTask(IAsyncTask* pTask) override final
    {
        const auto Priority = pTask->GetPriority();

        std::unique_lock<std::mutex> lock{m_TasksQueueMtx};

        auto it = m_TasksQueue.begin();
        while (it != m_TasksQueue.end() && it->second.pTask != pTask)
            ++it;
        if (it != m_TasksQueue.end())
        {
            if (it->first != Priority)
            {
                auto ExistingTaskInfo = std::move(it->second);
                m_TasksQueue.erase(it);
                m_TasksQueue.emplace(Priority, std::move(ExistingTaskInfo));
            }

            return true;
        }
        return false;
    }